

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.hpp
# Opt level: O2

TextureFormatInfoExt * __thiscall
Diligent::RenderDeviceBase<Diligent::EngineGLImplTraits>::GetTextureFormatInfoExt
          (RenderDeviceBase<Diligent::EngineGLImplTraits> *this,TEXTURE_FORMAT TexFormat)

{
  pointer pvVar1;
  TextureFormatInfoExt *pTVar2;
  ulong __n;
  reference rVar3;
  string msg;
  string local_50;
  
  if (TEX_FORMAT_ETC2_RGBA8_UNORM_SRGB < TexFormat) {
    FormatString<char[28]>(&local_50,(char (*) [28])"Texture format out of range");
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"GetTextureFormatInfoExt",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
               ,0x119);
    std::__cxx11::string::~string((string *)&local_50);
  }
  __n = (ulong)TexFormat;
  pvVar1 = (this->m_TextureFormatsInfo).
           super__Vector_base<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pvVar1[__n].super_TextureFormatInfo.super_TextureFormatAttribs.Format != TexFormat) {
    FormatString<char[20]>(&local_50,(char (*) [20])"Sanity check failed");
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"GetTextureFormatInfoExt",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
               ,0x11b);
    std::__cxx11::string::~string((string *)&local_50);
  }
  pTVar2 = pvVar1 + __n;
  rVar3 = std::vector<bool,_Diligent::STDAllocator<bool,_Diligent::IMemoryAllocator>_>::operator[]
                    (&this->m_TexFmtInfoInitFlags,__n);
  if ((*rVar3._M_p & rVar3._M_mask) == 0) {
    if ((pTVar2->super_TextureFormatInfo).Supported == true) {
      (*(this->super_ObjectBase<Diligent::IRenderDeviceGL>).
        super_RefCountedObject<Diligent::IRenderDeviceGL>.super_IRenderDeviceGL.super_IRenderDevice.
        super_IObject._vptr_IObject[0x26])(this,__n);
    }
    rVar3 = std::vector<bool,_Diligent::STDAllocator<bool,_Diligent::IMemoryAllocator>_>::operator[]
                      (&this->m_TexFmtInfoInitFlags,__n);
    *rVar3._M_p = *rVar3._M_p | rVar3._M_mask;
  }
  return pTVar2;
}

Assistant:

GetTextureFormatInfoExt(TEXTURE_FORMAT TexFormat) override final
    {
        VERIFY(TexFormat >= TEX_FORMAT_UNKNOWN && TexFormat < TEX_FORMAT_NUM_FORMATS, "Texture format out of range");
        const TextureFormatInfoExt& TexFmtInfo = m_TextureFormatsInfo[TexFormat];
        VERIFY(TexFmtInfo.Format == TexFormat, "Sanity check failed");
        if (!m_TexFmtInfoInitFlags[TexFormat])
        {
            if (TexFmtInfo.Supported)
                TestTextureFormat(TexFormat);
            m_TexFmtInfoInitFlags[TexFormat] = true;
        }
        return TexFmtInfo;
    }